

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O2

void __thiscall iutest::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  TerminateImpl(this);
  TestResult::~TestResult(&this->m_ad_hoc_testresult);
  std::_Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::~_Vector_base
            (&(this->m_testsuites).
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>);
  return;
}

Assistant:

~UnitTestImpl() { TerminateImpl(); }